

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

Serializer * __thiscall cfd::core::Serializer::operator<<(Serializer *this,uint8_t byte_data)

{
  uint8_t byte_data_local;
  Serializer *this_local;
  
  AddDirectByte(this,byte_data);
  return this;
}

Assistant:

Serializer& Serializer::operator<<(uint8_t byte_data) {
  AddDirectByte(byte_data);
  return *this;
}